

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReorder.c
# Opt level: O3

void Abc_NodeBddReorder(reo_man *p,Abc_Obj_t *pNode)

{
  size_t __size;
  int iVar1;
  int *piVar2;
  int *pOrder;
  DdNode *n;
  long lVar3;
  
  lVar3 = (long)(pNode->vFanins).nSize;
  __size = lVar3 * 4;
  pOrder = (int *)malloc(__size);
  if (0 < lVar3) {
    memset(pOrder,0xff,__size);
  }
  n = Extra_Reorder(p,(DdManager *)pNode->pNtk->pManFunc,(DdNode *)(pNode->field_5).pData,pOrder);
  Cudd_Ref(n);
  Cudd_RecursiveDeref((DdManager *)pNode->pNtk->pManFunc,(DdNode *)(pNode->field_5).pData);
  (pNode->field_5).pData = n;
  iVar1 = (pNode->vFanins).nSize;
  if ((long)iVar1 < 1) {
    if (pOrder == (int *)0x0) {
      return;
    }
  }
  else {
    piVar2 = (pNode->vFanins).pArray;
    lVar3 = 0;
    do {
      pOrder[lVar3] = piVar2[pOrder[lVar3]];
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
    if (0 < iVar1) {
      piVar2 = (pNode->vFanins).pArray;
      lVar3 = 0;
      do {
        piVar2[lVar3] = pOrder[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 < (pNode->vFanins).nSize);
    }
  }
  free(pOrder);
  return;
}

Assistant:

void Abc_NodeBddReorder( reo_man * p, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    DdNode * bFunc;
    int * pOrder, i;
    // create the temporary array for the variable order
    pOrder = ABC_ALLOC( int, Abc_ObjFaninNum(pNode) );
    for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
        pOrder[i] = -1;
    // reorder the BDD
    bFunc = Extra_Reorder( p, (DdManager *)pNode->pNtk->pManFunc, (DdNode *)pNode->pData, pOrder ); Cudd_Ref( bFunc );
    Cudd_RecursiveDeref( (DdManager *)pNode->pNtk->pManFunc, (DdNode *)pNode->pData );
    pNode->pData = bFunc;
    // update the fanin order
    Abc_ObjForEachFanin( pNode, pFanin, i )
        pOrder[i] = pNode->vFanins.pArray[ pOrder[i] ];
    Abc_ObjForEachFanin( pNode, pFanin, i )
        pNode->vFanins.pArray[i] = pOrder[i];
    ABC_FREE( pOrder );
}